

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeprom.c
# Opt level: O3

void write_half_eeprom(int active_dma,gbabus_t *bus,gbamem_t *mem,uint32_t address,uint16_t value)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  size_t *__s;
  int iVar6;
  uint uVar7;
  uint extraout_EDX;
  size_t __n;
  ulong uVar8;
  undefined4 in_register_0000003c;
  long lVar9;
  byte bVar10;
  uint uVar11;
  size_t sVar12;
  undefined4 uVar13;
  
  __s = (size_t *)CONCAT44(in_register_0000003c,active_dma);
  bVar10 = (byte)value;
  if (mem->eeprom_initialized == false) {
    switch(active_dma) {
    case 0:
      uVar4 = (bus->DMA0CNT_L).raw;
      break;
    case 1:
      uVar4 = (bus->DMA1CNT_L).raw;
      break;
    case 2:
      uVar4 = (bus->DMA2CNT_L).raw;
      break;
    case 3:
      uVar4 = (bus->DMA3CNT_L).raw;
      goto LAB_0011fad7;
    default:
      goto switchD_0011faba_default;
    }
    uVar4 = uVar4 & 0x3fff;
LAB_0011fad7:
    if (uVar4 == 0x11) {
      sVar12 = 0x2000;
      __s = (size_t *)malloc(0x2000);
      mem->backup = (uint8_t *)__s;
      __n = 0x2000;
LAB_0011fb23:
      bus = (gbabus_t *)0xff;
      memset(__s,0xff,__n);
      mem->backup_size = sVar12;
      mem->eeprom_initialized = true;
      read_persisted_backup();
      goto LAB_0011fb45;
    }
    bus = (gbabus_t *)(ulong)uVar4;
    if (uVar4 == 9) {
      sVar12 = 0x200;
      __s = (size_t *)malloc(0x200);
      mem->backup = (uint8_t *)__s;
      __n = 0x200;
      goto LAB_0011fb23;
    }
    goto switchD_0011faba_default;
  }
LAB_0011fb45:
  if (EEPROM_ACCEPT_WRITE_ADDRESS < mem->eeprom_state) goto switchD_0011fb63_caseD_2;
  switch(mem->eeprom_state) {
  case EEPROM_READY:
    mem->eeprom_command = bVar10 * '\x02' & 2;
    mem->eeprom_state = EEPROM_CMD_1;
    break;
  case EEPROM_CMD_1:
    bVar10 = bVar10 & 1 | mem->eeprom_command;
    mem->eeprom_command = bVar10;
    handle_eeprom_command(mem,bVar10);
    return;
  case EEPROM_WRITE:
    iVar1 = mem->eeprom_bits_remaining;
    if (0 < iVar1) {
      uVar7 = 0x40 - iVar1;
      uVar5 = 0x47 - iVar1;
      if (-1 < (int)uVar7) {
        uVar5 = uVar7;
      }
      uVar7 = ((uVar5 & 0xfffffff8) - uVar7) + 7;
      uVar5 = (int)uVar5 >> 3;
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Transferring %d/64 data bits (byte offset 0x%02X from base address, bit %d)\n\x1b[0;m"
               ,(ulong)(0x41 - iVar1),(ulong)uVar5,(ulong)uVar7);
      }
      uVar11 = value & 1;
      uVar8 = (long)(int)uVar5 + (ulong)mem->eeprom_address;
      bus = (gbabus_t *)(uVar8 & 0xffffffff);
      if (bus <= (gbabus_t *)mem->backup_size) {
        bVar10 = mem->backup[uVar8];
        bVar3 = (byte)(uVar11 << ((byte)uVar7 & 0x1f)) | ~(byte)(1 << ((byte)uVar7 & 0x1f)) & bVar10
        ;
        mem->backup[(long)bus] = bVar3;
        mem->backup_dirty = true;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Wrote bit %d to bit number %d in byte offset: %d. Old value: 0x%02X New value: 0x%02X\n\x1b[0;m"
                 ,(ulong)uVar11,(ulong)uVar7,(ulong)uVar5,(ulong)bVar10,(ulong)bVar3);
        }
LAB_0011fd66:
        mem->eeprom_bits_remaining = mem->eeprom_bits_remaining + -1;
        return;
      }
      goto LAB_0011fe06;
    }
    if (iVar1 == 0) {
      __s = (size_t *)(ulong)value;
      if ((value & 1) == 0) {
        mem->eeprom_bits_remaining = 10;
        mem->eeprom_state = EEPROM_POST_WRITE;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  EEPROM write stream completed.\n\x1b[0;m");
        }
        goto LAB_0011fd66;
      }
      goto LAB_0011fe1a;
    }
    goto LAB_0011fe15;
  case EEPROM_ACCEPT_READ_ADDRESS:
    if (mem->eeprom_bits_remaining < 1) {
      if ((gba_log_verbosity != 0 & bVar10) == 1) {
        printf("\x1b[0;33m[WARN]  Expected a value with an LSB of 0 here, got %d (0x%04X)\n\x1b[0;m"
               ,1,value);
      }
      uVar5 = gba_log_verbosity;
      uVar4 = mem->eeprom_address << 3;
      mem->eeprom_address = uVar4;
      if (uVar5 != 0) {
        printf("\x1b[0;33m[WARN]  Reading 64 bits from EEPROM starting at address: 0x%04X\n\x1b[0;m"
               ,(ulong)uVar4);
      }
      mem->eeprom_state = EEPROM_READ;
      mem->eeprom_bits_remaining = 0x44;
    }
    else {
      mem->eeprom_address = (value & 1) + mem->eeprom_address * 2;
      mem->eeprom_bits_remaining = mem->eeprom_bits_remaining + -1;
    }
    break;
  case EEPROM_ACCEPT_WRITE_ADDRESS:
    if (0 < mem->eeprom_bits_remaining) {
      iVar1 = (value & 1) + (uint)mem->eeprom_address * 2;
      mem->eeprom_address = (uint16_t)iVar1;
      iVar6 = mem->eeprom_bits_remaining + -1;
      mem->eeprom_bits_remaining = iVar6;
      if (iVar6 != 0) {
        return;
      }
      uVar5 = iVar1 * 8;
      mem->eeprom_address = (uint16_t)uVar5;
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Writing 64 bits to EEPROM starting at address: 0x%04X\n\x1b[0;m",
               (ulong)(uVar5 & 0xffff));
      }
      mem->eeprom_state = EEPROM_WRITE;
      mem->eeprom_bits_remaining = 0x40;
      return;
    }
    write_half_eeprom_cold_5();
  default:
switchD_0011fb63_caseD_2:
    mem = (gbamem_t *)&mem->eeprom_state;
    bus = (gbabus_t *)mem;
    write_half_eeprom_cold_6();
switchD_0011faba_default:
    write_half_eeprom_cold_1();
LAB_0011fe06:
    __s = &mem->backup_size;
    write_half_eeprom_cold_4();
LAB_0011fe15:
    write_half_eeprom_cold_2();
LAB_0011fe1a:
    write_half_eeprom_cold_3();
    if (3 < extraout_EDX) {
      uVar8 = __s[0x80e];
      uVar2 = __s[0x80f];
      lVar9 = 0;
      do {
        if (uVar8 < uVar2) {
          __s[0x80e] = uVar8 + 1;
          uVar13 = *(undefined4 *)((long)__s + (ulong)((uint)uVar8 & 0xfff) * 4 + 0x70);
          *(undefined4 *)((long)__s + 0x408c) = uVar13;
          uVar8 = uVar8 + 1;
        }
        else {
          uVar13 = *(undefined4 *)((long)__s + 0x408c);
        }
        *(undefined4 *)(&bus->interrupt_master_enable + lVar9 * 2) = uVar13;
        lVar9 = lVar9 + 1;
      } while (((ulong)(long)(int)extraout_EDX >> 2) +
               (ulong)((ulong)(long)(int)extraout_EDX >> 2 == 0) != lVar9);
    }
    return;
  }
  return;
}

Assistant:

void write_half_eeprom(int active_dma, gbabus_t* bus, gbamem_t* mem, word address, half value) {
    if (!mem->eeprom_initialized) {
        int wc;
        switch (active_dma) {
            case 0:
                wc = bus->DMA0CNT_L.wc;
                break;
            case 1:
                wc = bus->DMA1CNT_L.wc;
                break;
            case 2:
                wc = bus->DMA2CNT_L.wc;
                break;
            case 3:
                wc = bus->DMA3CNT_L.wc;
                break;
        }

        switch (wc) {
            case 9: // 9 bits = 2 for command, 6 for address, 1 to end command
                if (!mem->eeprom_initialized) {
                    init_eeprom(mem, EEPROM_512);
                }
                break;
            case 17: // 17 bits = 2 for command, 14 for address, 1 to end command
                if (!mem->eeprom_initialized) {
                    init_eeprom(mem, EEPROM_8K);
                }
                break;
            default:
                logfatal("Write to EEPROM with active DMA %d and a WC of %d", active_dma, wc)
        }
    }

    switch (mem->eeprom_state) {
        case EEPROM_READY:
            mem->eeprom_command = (value & 1) << 1;
            mem->eeprom_state = EEPROM_CMD_1;
            break;
        case EEPROM_CMD_1:
            mem->eeprom_command |= (value & 1);
            handle_eeprom_command(mem, mem->eeprom_command);
            break;
        case EEPROM_ACCEPT_READ_ADDRESS:
            if (mem->eeprom_bits_remaining > 0) {
                mem->eeprom_address <<= 1;
                mem->eeprom_address |= (value & 1);
                mem->eeprom_bits_remaining--;
            } else {
                if ((value & 1) != 0) {
                    logwarn("Expected a value with an LSB of 0 here, got %d (0x%04X)", value & 1, value)
                }
                mem->eeprom_address <<= 3; // Addresses are in 8 bit blocks
                logwarn("Reading 64 bits from EEPROM starting at address: 0x%04X", mem->eeprom_address)
                mem->eeprom_state = EEPROM_READ;
                mem->eeprom_bits_remaining = 64 + 4; // Plus 4 garbage bits
            }
            break;
        case EEPROM_ACCEPT_WRITE_ADDRESS:
            if (mem->eeprom_bits_remaining > 0) {
                mem->eeprom_address <<= 1;
                mem->eeprom_address |= (value & 1);
                if (--mem->eeprom_bits_remaining == 0) {
                    mem->eeprom_address <<= 3; // Addresses are in 8-byte blocks
                    logwarn("Writing 64 bits to EEPROM starting at address: 0x%04X", mem->eeprom_address)
                    mem->eeprom_state = EEPROM_WRITE;
                    mem->eeprom_bits_remaining = 64;
                }
            } else {
                logfatal("Trying to accept a write address when one is unexpected!")
            }
            break;
        case EEPROM_WRITE: {
            int bit = 64 - mem->eeprom_bits_remaining;
            if (mem->eeprom_bits_remaining > 0) {
                int byte_offset = bit / 8;
                int bit_in_byte = 7 - (bit % 8); // MSB first
                byte mask = ~(1 << bit_in_byte);
                logwarn("Transferring %d/64 data bits (byte offset 0x%02X from base address, bit %d)", bit + 1,
                        byte_offset, bit_in_byte)
                byte eeprom_value = mem->backup[mem->eeprom_address + byte_offset];
                byte old_value = eeprom_value;
                eeprom_value &= mask;
                eeprom_value |= ((value & 1) << bit_in_byte);
                word index = mem->eeprom_address + byte_offset;
                if (index > mem->backup_size) {
                    logfatal("Access to EEPROM outside backup space! Index: %d Backup size: %zu", index, mem->backup_size)
                }
                mem->backup[index] = eeprom_value;
                mem->backup_dirty = true;
                logwarn("Wrote bit %d to bit number %d in byte offset: %d. Old value: 0x%02X New value: 0x%02X",
                        value & 1, bit_in_byte, byte_offset, old_value, eeprom_value);
            } else if (mem->eeprom_bits_remaining == 0) {
                if ((value & 1) != 0) {
                    logfatal("Expected a write with an LSB of 0 after an EEPROM write stream, instead, got: 0x%04X",
                             value)
                }
                mem->eeprom_bits_remaining = EEPROM_READS_UNTIL_READY;
                mem->eeprom_state = EEPROM_POST_WRITE; // Entire stream has been written
                logwarn("EEPROM write stream completed.")
            } else {
                logfatal("Tried to read from EEPROM when no data was remaining")
            }
            mem->eeprom_bits_remaining--;
            break;
        }
        default:
            logfatal("Write half 0x%04X to EEPROM in unknown state: %d at addr 0x%08X", value, mem->eeprom_state, address)
    }
}